

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbarlayout.cpp
# Opt level: O0

QToolBarItem * __thiscall QToolBarLayout::createItem(QToolBarLayout *this,QAction *action)

{
  QToolBar *pQVar1;
  QWidgetAction *pQVar2;
  ulong uVar3;
  char *pcVar4;
  QAction *in_RSI;
  long in_FS_OFFSET;
  QToolBarItem *result;
  QToolButton *button;
  QToolBarSeparator *sep;
  QWidgetAction *widgetAction;
  QToolBar *tb;
  QWidget *widget;
  bool standardButtonWidget;
  bool customWidget;
  undefined4 in_stack_ffffffffffffff38;
  QFlagsStorage<Qt::AlignmentFlag> in_stack_ffffffffffffff3c;
  QWidget *in_stack_ffffffffffffff40;
  QWidget *in_stack_ffffffffffffff48;
  ToolButtonStyle style;
  QToolBarSeparator *in_stack_ffffffffffffff50;
  QWidget *in_stack_ffffffffffffff70;
  QWidgetAction *in_stack_ffffffffffffff78;
  QWidget *pQVar5;
  undefined6 in_stack_ffffffffffffffa8;
  byte bVar6;
  byte bVar7;
  QToolBarItem *local_40;
  Connection local_30;
  Connection local_28;
  Connection local_20;
  QSize local_18;
  Connection local_10;
  QAction *action_00;
  
  action_00 = *(QAction **)(in_FS_OFFSET + 0x28);
  bVar7 = 0;
  bVar6 = 0;
  pQVar5 = (QWidget *)0x0;
  QLayout::parentWidget((QLayout *)in_stack_ffffffffffffff50);
  pQVar1 = qobject_cast<QToolBar*>((QObject *)0x6fcd91);
  if (pQVar1 == (QToolBar *)0x0) {
    local_40 = (QToolBarItem *)0x0;
  }
  else {
    pQVar2 = qobject_cast<QWidgetAction*>((QObject *)0x6fcdb9);
    if (pQVar2 == (QWidgetAction *)0x0) {
      uVar3 = QAction::isSeparator();
      if ((uVar3 & 1) != 0) {
        pQVar5 = (QWidget *)operator_new(0x30);
        QToolBarSeparator::QToolBarSeparator
                  (in_stack_ffffffffffffff50,(QToolBar *)in_stack_ffffffffffffff48);
        in_stack_ffffffffffffff70 = pQVar5;
        QObject::connect((QObject *)&local_10,(char *)pQVar1,
                         (QObject *)"2orientationChanged(Qt::Orientation)",(char *)pQVar5,0xb28eec);
        QMetaObject::Connection::~Connection(&local_10);
      }
    }
    else {
      pQVar5 = QWidgetAction::requestWidget(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      if (pQVar5 != (QWidget *)0x0) {
        QWidget::setAttribute
                  ((QWidget *)CONCAT17(bVar7,CONCAT16(bVar6,in_stack_ffffffffffffffa8)),
                   (WidgetAttribute)((ulong)pQVar5 >> 0x20),SUB81((ulong)pQVar5 >> 0x18,0));
        bVar7 = 1;
      }
    }
    if (pQVar5 == (QWidget *)0x0) {
      pcVar4 = (char *)operator_new(0x28);
      QToolButton::QToolButton((QToolButton *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      QToolButton::setAutoRaise
                ((QToolButton *)in_stack_ffffffffffffff50,
                 SUB81((ulong)in_stack_ffffffffffffff48 >> 0x38,0));
      QWidget::setFocusPolicy(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c.i);
      local_18 = QToolBar::iconSize((QToolBar *)in_stack_ffffffffffffff40);
      QAbstractButton::setIconSize
                ((QAbstractButton *)in_stack_ffffffffffffff50,(QSize *)in_stack_ffffffffffffff48);
      style = (ToolButtonStyle)((ulong)in_stack_ffffffffffffff48 >> 0x20);
      QToolBar::toolButtonStyle((QToolBar *)in_stack_ffffffffffffff40);
      QToolButton::setToolButtonStyle((QToolButton *)in_stack_ffffffffffffff50,style);
      QObject::connect((QObject *)&local_20,(char *)pQVar1,(QObject *)"2iconSizeChanged(QSize)",
                       pcVar4,0xb28f5a);
      QMetaObject::Connection::~Connection(&local_20);
      QObject::connect((QObject *)&local_28,(char *)pQVar1,
                       (QObject *)"2toolButtonStyleChanged(Qt::ToolButtonStyle)",pcVar4,0xb28f6e);
      QMetaObject::Connection::~Connection(&local_28);
      QToolButton::setDefaultAction((QToolButton *)in_stack_ffffffffffffff70,action_00);
      QObject::connect((QObject *)&local_30,pcVar4,(QObject *)"2triggered(QAction*)",(char *)pQVar1,
                       0xb28f97);
      QMetaObject::Connection::~Connection(&local_30);
      bVar6 = 1;
    }
    QWidget::hide((QWidget *)0x6fcfd6);
    local_40 = (QToolBarItem *)operator_new(0x28);
    QToolBarItem::QToolBarItem
              ((QToolBarItem *)in_stack_ffffffffffffff40,
               (QWidget *)CONCAT44(in_stack_ffffffffffffff3c.i,in_stack_ffffffffffffff38));
    if ((bVar6 & 1) != 0) {
      QFlags<Qt::AlignmentFlag>::QFlags
                ((QFlags<Qt::AlignmentFlag> *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c.i)
      ;
      QLayoutItem::setAlignment((QLayoutItem *)0x6fd030,(Alignment)in_stack_ffffffffffffff3c.i);
    }
    local_40->customWidget = (bool)(bVar7 & 1);
    local_40->action = in_RSI;
  }
  if (*(QAction **)(in_FS_OFFSET + 0x28) != action_00) {
    __stack_chk_fail();
  }
  return local_40;
}

Assistant:

QToolBarItem *QToolBarLayout::createItem(QAction *action)
{
    bool customWidget = false;
    bool standardButtonWidget = false;
    QWidget *widget = nullptr;
    QToolBar *tb = qobject_cast<QToolBar*>(parentWidget());
    if (!tb)
        return (QToolBarItem *)nullptr;

    if (QWidgetAction *widgetAction = qobject_cast<QWidgetAction *>(action)) {
        widget = widgetAction->requestWidget(tb);
        if (widget != nullptr) {
            widget->setAttribute(Qt::WA_LayoutUsesWidgetRect);
            customWidget = true;
        }
    } else if (action->isSeparator()) {
        QToolBarSeparator *sep = new QToolBarSeparator(tb);
        connect(tb, SIGNAL(orientationChanged(Qt::Orientation)),
                sep, SLOT(setOrientation(Qt::Orientation)));
        widget = sep;
    }

    if (!widget) {
        QToolButton *button = new QToolButton(tb);
        button->setAutoRaise(true);
        button->setFocusPolicy(Qt::NoFocus);
        button->setIconSize(tb->iconSize());
        button->setToolButtonStyle(tb->toolButtonStyle());
        QObject::connect(tb, SIGNAL(iconSizeChanged(QSize)),
                         button, SLOT(setIconSize(QSize)));
        QObject::connect(tb, SIGNAL(toolButtonStyleChanged(Qt::ToolButtonStyle)),
                         button, SLOT(setToolButtonStyle(Qt::ToolButtonStyle)));
        button->setDefaultAction(action);
        QObject::connect(button, SIGNAL(triggered(QAction*)), tb, SIGNAL(actionTriggered(QAction*)));
        widget = button;
        standardButtonWidget = true;
    }

    widget->hide();
    QToolBarItem *result = new QToolBarItem(widget);
    if (standardButtonWidget)
        result->setAlignment(Qt::AlignJustify);
    result->customWidget = customWidget;
    result->action = action;
    return result;
}